

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Option<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
 __thiscall
Lib::
Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar4;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> **in_RDX;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar5;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar6;
  
  uVar3 = hashCode((Map<const_Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
                    *)key,in_RDX);
  pMVar4 = key[1];
  ppMVar6 = (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
  pMVar5 = pMVar4 + (ulong)uVar3 % (ulong)*(uint *)key;
  do {
    uVar1 = (uint)(pMVar5->_factors)._capacity;
    if (uVar1 == 0) {
LAB_00291513:
      *(MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> ***)this = ppMVar6;
      return (OptionBase<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
              )(OptionBase<const_Lib::Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
                )this;
    }
    if (uVar1 == uVar3) {
      bVar2 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
              operator==((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                          *)(pMVar5->_factors)._stack,&(*in_RDX)->_factors);
      if (bVar2) {
        ppMVar6 = &(pMVar5->_factors)._cursor;
        goto LAB_00291513;
      }
      pMVar4 = key[1];
    }
    pMVar5 = pMVar5 + 1;
    if (pMVar5 == key[2]) {
      pMVar5 = pMVar4;
    }
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }